

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O2

void __thiscall soplex::SPxBasisBase<double>::setStatus(SPxBasisBase<double> *this,SPxStatus stat)

{
  SPxOut *pSVar1;
  undefined1 auStack_14 [4];
  
  if ((this->thestatus != stat) && (this->thestatus = stat, stat == NO_PROBLEM)) {
    if (((this->factorized != false) || (this->matrixIsSetup == true)) &&
       ((pSVar1 = this->spxout, pSVar1 != (SPxOut *)0x0 && (4 < (int)pSVar1->m_verbosity)))) {
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = soplex::operator<<(this->spxout,"ICHBAS09 explicit invalidation of factorization");
      std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,auStack_14);
    }
    this->factorized = false;
    this->matrixIsSetup = false;
    return;
  }
  return;
}

Assistant:

void setStatus(SPxStatus stat)
   {

      if(thestatus != stat)
      {
         SPxOut::debug(this, "DBSTAT01 SPxBasisBase<R>::setStatus(): status: {} ({}) -> {} ({})\n",
                       int(thestatus), thestatus, int(stat), stat);

         thestatus = stat;

         if(stat == NO_PROBLEM)
            invalidate();
      }
   }